

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

token * attribute_transparent_union(dmr_C *C,token *token,symbol *attr,decl_state *ctx)

{
  symbol *psVar1;
  decl_state *ctx_local;
  symbol *attr_local;
  token *token_local;
  dmr_C *C_local;
  
  if (C->Wtransparent_union != 0) {
    dmrC_warning(C,token->pos,"attribute __transparent_union__");
  }
  if (((ctx->ctype).base_type == (symbol *)0x0) ||
     (((undefined1  [232])*(ctx->ctype).base_type & (undefined1  [232])0xff) !=
      (undefined1  [232])0x8)) {
    dmrC_warning(C,token->pos,"attribute __transparent_union__ applied to non-union type");
  }
  else {
    psVar1 = (ctx->ctype).base_type;
    *(uint *)((long)&psVar1->field_14 + 0xc) =
         *(uint *)((long)&psVar1->field_14 + 0xc) & 0xfbffffff | 0x4000000;
  }
  return token;
}

Assistant:

static struct token *attribute_transparent_union(struct dmr_C *C, struct token *token, struct symbol *attr, struct decl_state *ctx)
{
        (void) attr;
	if (C->Wtransparent_union)
		dmrC_warning(C, token->pos, "attribute __transparent_union__");
	if (ctx->ctype.base_type && ctx->ctype.base_type->type == SYM_UNION)
		ctx->ctype.base_type->transparent_union = 1;
	else
		dmrC_warning(C, token->pos, "attribute __transparent_union__ applied to non-union type");
	return token;
}